

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O0

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *in_RSI;
  int *in_RDI;
  uint32_t le;
  uint32_t run_start;
  int i;
  int32_t pos;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  int local_1c;
  _Bool local_1;
  
  iVar1 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == *in_RSI) {
    local_1c = 0;
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      uVar2 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 4);
      uVar3 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4);
      if (*(ushort *)(*(long *)(in_RSI + 2) + (long)local_1c * 2) != uVar2) {
        return false;
      }
      if ((uint)*(ushort *)(*(long *)(in_RSI + 2) + (ulong)(local_1c + uVar3) * 2) != uVar2 + uVar3)
      {
        return false;
      }
      local_1c = uVar3 + 1 + local_1c;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}